

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O1

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,_1,_0,__1,_1> *workspace)

{
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *local_c8;
  ulong local_c0;
  ulong local_b8;
  Matrix<double,__1,__1,_0,__1,__1> *local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  Matrix<double,__1,_1,_0,__1,_1> *local_88;
  double *local_80;
  Matrix<double,__1,__1,_0,__1,__1> *local_78;
  long local_70;
  EssentialVectorType local_68;
  
  lVar9 = *(long *)(*(long *)this + 8);
  if (lVar9 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)workspace,lVar9,lVar9,1);
  lVar9 = *(long *)(this + 0x18);
  pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar13 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar11 = (*(undefined8 **)this)[1];
  local_88 = workspace;
  if (lVar13 == lVar11 && (double *)**(undefined8 **)this == pdVar5) {
    lVar11 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
    if ((lVar11 < 0) || (lVar13 < 0)) {
      __assert_fail("a_index <= m_matrix.cols() && -a_index <= m_matrix.rows()",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Diagonal.h"
                    ,0x4b,
                    "Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>::Diagonal(MatrixType &, Index) [MatrixType = Eigen::Matrix<double, -1, -1>, Index = 0]"
                   );
    }
    if (lVar13 <= lVar11) {
      lVar11 = lVar13;
    }
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      *pdVar5 = 1.0;
      pdVar5 = pdVar5 + lVar13 + 1;
    }
    local_c8 = (double *)0x0;
    local_68.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
    m_data = (PointerType)dst;
    TriangularViewImpl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U,_Eigen::Dense>::setConstant
              ((TriangularViewImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U,_Eigen::Dense> *)
               &local_68,(Scalar *)&local_c8);
    local_90 = lVar9;
    local_78 = dst;
    if (0 < lVar9) {
      lVar11 = -lVar9;
      lVar13 = lVar9 * 8;
      lVar9 = lVar9 + 1;
      do {
        pMVar1 = local_78;
        lVar13 = lVar13 + -8;
        lVar2 = lVar9 + -2;
        lVar14 = *(long *)(*(long *)this + 8);
        lVar3 = *(long *)(this + 0x20);
        local_c0 = (lVar14 - lVar3) + lVar11 + 1;
        local_b8 = local_c0;
        if (this[0x10] ==
            (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
             )0x1) {
          pdVar5 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          lVar12 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          lVar10 = (lVar3 + lVar12) - lVar14;
          uVar4 = (((lVar3 + (local_78->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_cols) - lVar14) + lVar9) - 2;
          local_c8 = pdVar5 + lVar9 + lVar10 + uVar4 * lVar12 + -2;
          if (pdVar5 != (double *)0x0 && (long)local_c0 < 0) goto LAB_0014bdb9;
          local_a8 = (lVar10 + lVar9) - 2;
          local_b0 = local_78;
          local_a0 = uVar4;
          local_98 = lVar12;
          if (((long)(local_a8 | local_c0) < 0) || ((long)(uVar4 | local_c0) < 0))
          goto LAB_0014bd9a;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_68,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,lVar2);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_c8,&local_68,(Scalar *)(**(long **)(this + 8) + lVar13),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        else {
          pdVar5 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          lVar12 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          lVar10 = (lVar3 + lVar12) - lVar14;
          uVar4 = (((lVar3 + (local_78->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_cols) - lVar14) + lVar9) - 2;
          local_c8 = pdVar5 + lVar9 + lVar10 + uVar4 * lVar12 + -2;
          if (pdVar5 != (double *)0x0 && (long)local_c0 < 0) goto LAB_0014bdb9;
          local_a8 = (lVar10 + lVar9) - 2;
          local_b0 = local_78;
          local_a0 = uVar4;
          local_98 = lVar12;
          if (((long)(local_a8 | local_c0) < 0) || ((long)(uVar4 | local_c0) < 0))
          goto LAB_0014bd9a;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_68,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,lVar2);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_c8,&local_68,(Scalar *)(**(long **)(this + 8) + lVar13),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        pdVar5 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar14 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows;
        if (lVar14 < 0 && pdVar5 != (double *)0x0) goto LAB_0014bd83;
        local_70 = lVar9 + -1;
        if ((pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols < local_70) goto LAB_0014bd17;
        lVar3 = *(long *)(*(long *)this + 8);
        uVar4 = lVar11 + lVar3;
        if ((pdVar5 != (double *)0x0) && ((long)uVar4 < 0)) goto LAB_0014bd6c;
        if ((long)((lVar9 + (lVar14 - lVar3)) - 1U | uVar4) < 0) goto LAB_0014bd55;
        if ((long)uVar4 < 0) goto LAB_0014bd36;
        pdVar5 = pdVar5 + lVar14 * lVar2 + lVar9 + (lVar14 - lVar3) + -1;
        uVar8 = uVar4;
        if ((((ulong)pdVar5 & 7) == 0) &&
           (uVar8 = (ulong)((uint)((ulong)pdVar5 >> 3) & 1), (long)uVar4 <= (long)uVar8)) {
          uVar8 = uVar4;
        }
        if (0 < (long)uVar8) {
          memset(pdVar5,0,uVar8 * 8);
        }
        lVar9 = lVar11 + (lVar3 - uVar8);
        uVar7 = lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffe;
        lVar2 = uVar7 + uVar8;
        if (1 < lVar9) {
          lVar14 = uVar8 + 2;
          if ((long)(uVar8 + 2) < lVar2) {
            lVar14 = lVar2;
          }
          local_80 = pdVar5;
          memset(pdVar5 + uVar8,0,(~uVar8 + lVar14 & 0xfffffffffffffffe) * 8 + 0x10);
          pdVar5 = local_80;
        }
        if (lVar2 < (long)uVar4) {
          memset(pdVar5 + (lVar9 / 2) * 2 + uVar8,0,(((lVar3 - uVar8) - uVar7) + lVar11) * 8);
        }
        lVar11 = lVar11 + 1;
        workspace = local_88;
        lVar9 = local_70;
      } while (1 < local_70);
    }
    lVar9 = *(long *)(*(long *)this + 8);
    if (local_90 < lVar9) {
      lVar11 = -1;
      lVar13 = 0;
      do {
        pdVar5 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar2 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        if (lVar2 < 0 && pdVar5 != (double *)0x0) goto LAB_0014bd83;
        if ((local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar13) {
LAB_0014bd17:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                        ,0x7a,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                       );
        }
        uVar4 = lVar9 + lVar11;
        if ((long)uVar4 < 0 && pdVar5 != (double *)0x0) goto LAB_0014bd6c;
        if ((long)((lVar2 - lVar9) + lVar13 + 1U | uVar4) < 0) goto LAB_0014bd55;
        if ((long)uVar4 < 0) {
LAB_0014bd36:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        pdVar5 = pdVar5 + lVar2 * lVar13 + (lVar2 - lVar9) + lVar13 + 1;
        uVar8 = uVar4;
        if ((((ulong)pdVar5 & 7) == 0) &&
           (uVar8 = (ulong)((uint)((ulong)pdVar5 >> 3) & 1), (long)uVar4 <= (long)uVar8)) {
          uVar8 = uVar4;
        }
        if (0 < (long)uVar8) {
          memset(pdVar5,0,uVar8 * 8);
        }
        lVar2 = uVar4 - uVar8;
        lVar14 = (lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
        if (1 < lVar2) {
          lVar3 = uVar8 + 2;
          if ((long)(uVar8 + 2) < lVar14) {
            lVar3 = lVar14;
          }
          memset(pdVar5 + uVar8,0,(~uVar8 + lVar3 & 0xfffffffffffffffe) * 8 + 0x10);
        }
        if (lVar14 < (long)uVar4) {
          memset(pdVar5 + (lVar2 / 2) * 2 + uVar8,0,
                 (((lVar9 + lVar11) - uVar8) + (lVar2 / 2) * -2) * 8);
        }
        lVar13 = lVar13 + 1;
        lVar9 = *(long *)(*(long *)this + 8);
        lVar11 = lVar11 + -1;
      } while (lVar13 < lVar9 - local_90);
    }
  }
  else {
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst,lVar11,lVar11);
    if (0x30 < lVar9) {
      applyThisOnTheLeft<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (this,dst,workspace,true);
      return;
    }
    if (0 < lVar9) {
      lVar13 = lVar9 + 1;
      lVar11 = -lVar9;
      lVar9 = lVar9 * 8;
      do {
        lVar9 = lVar9 + -8;
        lVar11 = lVar11 + 1;
        lVar2 = *(long *)(*(long *)this + 8);
        lVar14 = *(long *)(this + 0x20);
        local_c0 = (lVar2 - lVar14) + lVar11;
        local_b8 = local_c0;
        if (this[0x10] ==
            (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
             )0x1) {
          pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_data;
          lVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_rows;
          lVar12 = (lVar14 + lVar3) - lVar2;
          uVar4 = (((lVar14 + (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              ).m_storage.m_cols) - lVar2) + lVar13) - 2;
          local_c8 = pdVar5 + lVar13 + lVar12 + uVar4 * lVar3 + -2;
          if (pdVar5 != (double *)0x0 && (long)local_c0 < 0) goto LAB_0014bdb9;
          local_a8 = (lVar13 + lVar12) - 2;
          local_b0 = dst;
          local_a0 = uVar4;
          local_98 = lVar3;
          if (((long)(local_a8 | local_c0) < 0) || ((long)(uVar4 | local_c0) < 0))
          goto LAB_0014bd9a;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_68,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,lVar13 + -2);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_c8,&local_68,(Scalar *)(**(long **)(this + 8) + lVar9),
                     (local_88->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        else {
          pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_data;
          lVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_rows;
          lVar12 = (lVar14 + lVar3) - lVar2;
          uVar4 = (((lVar14 + (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              ).m_storage.m_cols) - lVar2) + lVar13) - 2;
          local_c8 = pdVar5 + lVar13 + lVar12 + uVar4 * lVar3 + -2;
          if (pdVar5 != (double *)0x0 && (long)local_c0 < 0) goto LAB_0014bdb9;
          local_a8 = (lVar13 + lVar12) - 2;
          local_b0 = dst;
          local_a0 = uVar4;
          local_98 = lVar3;
          if (((long)(local_a8 | local_c0) < 0) || ((long)(uVar4 | local_c0) < 0))
          goto LAB_0014bd9a;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_68,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,lVar13 + -2);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_c8,&local_68,(Scalar *)(**(long **)(this + 8) + lVar9),
                     (local_88->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        lVar13 = lVar13 + -1;
      } while (1 < lVar13);
    }
  }
  return;
LAB_0014bdb9:
  pcVar6 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Level = 0]"
  ;
  local_c0 = local_b8;
  goto LAB_0014bdce;
LAB_0014bd9a:
  pcVar6 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
  ;
  local_c0 = local_b8;
  goto LAB_0014bdaf;
LAB_0014bd83:
  pcVar6 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
  ;
  goto LAB_0014bdce;
LAB_0014bd55:
  pcVar6 = 
  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0014bdaf:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                ,0x93,pcVar6);
LAB_0014bd6c:
  pcVar6 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, Level = 0]"
  ;
LAB_0014bdce:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,pcVar6);
}

Assistant:

EIGEN_DEVICE_FUNC
    void evalTo(Dest& dst, Workspace& workspace) const
    {
      workspace.resize(rows());
      Index vecs = m_length;
      if(internal::is_same_dense(dst,m_vectors))
      {
        // in-place
        dst.diagonal().setOnes();
        dst.template triangularView<StrictlyUpper>().setZero();
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_reverse)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());

          // clear the off diagonal vector
          dst.col(k).tail(rows()-k-1).setZero();
        }
        // clear the remaining columns if needed
        for(Index k = 0; k<cols()-vecs ; ++k)
          dst.col(k).tail(rows()-k-1).setZero();
      }
      else if(m_length>BlockSize)
      {
        dst.setIdentity(rows(), rows());
        if(m_reverse)
          applyThisOnTheLeft(dst,workspace,true);
        else
          applyThisOnTheLeft(dst,workspace,true);
      }
      else
      {
        dst.setIdentity(rows(), rows());
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_reverse)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());
        }
      }
    }